

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxSelf::Emit(FxSelf *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  
  if (this->check == true) {
    VMFunctionBuilder::Emit(build,0xcf,1,0,1);
    VMFunctionBuilder::Emit(build,0x44,1);
    VMFunctionBuilder::Emit(build,0x52,2,5);
  }
  EVar1.RegNum = 0;
  EVar1.RegType = '\x03';
  EVar1.RegCount = '\x01';
  EVar1.Konst = false;
  EVar1.Fixed = true;
  EVar1.Final = false;
  EVar1.Target = false;
  return EVar1;
}

Assistant:

ExpEmit FxSelf::Emit(VMFunctionBuilder *build)
{
	if (check)
	{
		build->Emit(OP_EQA_R, 1, 0, 1);
		build->Emit(OP_JMP, 1);
		build->Emit(OP_THROW, 2, X_BAD_SELF);
	}
	// self is always the first pointer passed to the function
	return ExpEmit(0, REGT_POINTER, false, true);
}